

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall TestMaterial::GeneralTest(TestMaterial *this)

{
  Vector3T *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  clock_t cVar6;
  clock_t cVar7;
  clock_t cVar8;
  ostream *poVar9;
  ulong uVar10;
  long lVar11;
  long i;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double angle;
  double local_368;
  double dStack_360;
  double local_358;
  double local_348;
  double local_338;
  Vector3T<double,_false> vr;
  CD_Scene testscene;
  long local_2b8;
  Point3 p;
  fstream outfile;
  undefined8 auStack_238 [65];
  
  std::fstream::fstream(&outfile);
  std::fstream::open((char *)&outfile,0x10629c);
  *(undefined8 *)((long)auStack_238 + *(long *)(_outfile + -0x18)) = 0x12;
  for (uVar10 = 0;
      uVar10 < (ulong)(((long)(this->stppObjects).
                              super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->stppObjects).
                             super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x148); uVar10 = uVar10 + 1
      ) {
    sch::CD_Scene::CD_Scene(&testscene);
    sch::CD_Scene::addObject((S_Object *)&testscene);
    sch::S_Object::resetTransformation();
    sch::CD_Scene::addObject((S_Object *)&testscene);
    angle = 0.0;
    local_368 = 0.0;
    dStack_360 = 0.0;
    local_358 = 1.0;
    sch::S_Object::setOrientation(*(double **)(local_2b8 + 8),(Vector3T *)&angle);
    sch::S_Object::setPosition(*(Vector3T **)(local_2b8 + 8));
    sch::CD_Scene::sceneProximityQuery();
    display();
    clock();
    lVar11 = 1000000;
    while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      iVar5 = rand();
      dVar13 = log((double)iVar2 / 2147483647.0);
      if (dVar13 * -2.0 < 0.0) {
        sqrt(dVar13 * -2.0);
      }
      cos(((double)iVar3 / 2147483647.0) * 6.283185307179586);
      dVar13 = log((double)iVar3 / 2147483647.0);
      if (dVar13 * -2.0 < 0.0) {
        sqrt(dVar13 * -2.0);
      }
      cos(((double)iVar2 / 2147483647.0) * 6.283185307179586);
      dVar13 = log((double)iVar4 / 2147483647.0);
      if (dVar13 * -2.0 < 0.0) {
        sqrt(dVar13 * -2.0);
      }
      cos(((double)iVar5 / 2147483647.0) * 6.283185307179586);
    }
    clock();
    clock();
    lVar11 = 1000000;
    while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      iVar5 = rand();
      dVar13 = log((double)iVar2 / 2147483647.0);
      dVar13 = dVar13 * -2.0;
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      local_348 = (double)iVar3 / 2147483647.0;
      local_338 = cos(local_348 * 6.283185307179586);
      dVar14 = log(local_348);
      dVar14 = dVar14 * -2.0;
      if (dVar14 < 0.0) {
        local_348 = sqrt(dVar14);
      }
      else {
        local_348 = SQRT(dVar14);
      }
      dVar14 = cos(((double)iVar2 / 2147483647.0) * 6.283185307179586);
      dVar15 = log((double)iVar4 / 2147483647.0);
      dVar15 = dVar15 * -2.0;
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      dVar16 = cos(((double)iVar5 / 2147483647.0) * 6.283185307179586);
      vr.m_z = dVar16 * dVar15;
      vr.m_x = local_338 * dVar13;
      vr.m_y = dVar14 * local_348;
      (**(code **)(**(long **)(local_2b8 + 8) + 0x20))(&p,*(long **)(local_2b8 + 8),&vr);
    }
    clock();
    local_348 = (double)clock();
    for (lVar11 = 0; lVar11 != 10000; lVar11 = lVar11 + 1) {
      dVar13 = (double)lVar11;
      dVar14 = dVar13 * 0.0006000000000000001;
      dVar15 = sin(dVar14);
      local_368 = sin(dVar15 * 42.0);
      dVar15 = sin(dVar14);
      dStack_360 = sin(dVar15 * -43.0);
      dVar15 = sin(dVar13 * 0.00030000000000000003);
      local_358 = cos(dVar15 * 83.0);
      dVar15 = sin(dVar13 * 0.0015);
      dVar15 = sin(dVar15 * 0.2);
      dVar15 = sin(dVar15 * 97.0);
      angle = dVar15 * 4.0;
      sch::S_Object::setOrientation(*(double **)(local_2b8 + 8),(Vector3T *)&angle);
      pVVar1 = *(Vector3T **)(local_2b8 + 8);
      dVar15 = sin(dVar14);
      local_338 = sin(dVar15 * 20.0);
      dVar13 = sin(dVar13 * 0.00045);
      dVar13 = sin(dVar13 * -69.0);
      dVar14 = sin(dVar14);
      dVar14 = sin(dVar14 * 20.0);
      vr.m_x = local_338 * 0.6 + 0.0;
      vr.m_y = dVar13 * 0.6 + 0.33333333333333337;
      vr.m_z = dVar14 * 0.6 + 0.28571428571428575;
      sch::S_Object::setPosition(pVVar1);
    }
    cVar6 = clock();
    cVar7 = clock();
    for (lVar11 = 0; lVar11 != 10000; lVar11 = lVar11 + 1) {
      dVar13 = (double)lVar11;
      dVar14 = dVar13 * 0.0006000000000000001;
      dVar15 = sin(dVar14);
      local_368 = sin(dVar15 * 42.0);
      dVar15 = sin(dVar14);
      dStack_360 = sin(dVar15 * -43.0);
      dVar15 = sin(dVar13 * 0.00030000000000000003);
      local_358 = cos(dVar15 * 83.0);
      dVar15 = sin(dVar13 * 0.0015);
      dVar15 = sin(dVar15 * 0.2);
      dVar15 = sin(dVar15 * 97.0);
      angle = dVar15 * 4.0;
      sch::S_Object::setOrientation(*(double **)(local_2b8 + 8),(Vector3T *)&angle);
      pVVar1 = *(Vector3T **)(local_2b8 + 8);
      dVar15 = sin(dVar14);
      local_338 = sin(dVar15 * 20.0);
      dVar13 = sin(dVar13 * 0.00045);
      dVar13 = sin(dVar13 * -69.0);
      dVar14 = sin(dVar14);
      dVar14 = sin(dVar14 * 20.0);
      vr.m_x = local_338 * 0.6 + 0.0;
      vr.m_y = dVar13 * 0.6 + 0.33333333333333337;
      vr.m_z = dVar14 * 0.6 + 0.28571428571428575;
      sch::S_Object::setPosition(pVVar1);
      sch::CD_Scene::sceneProximityQuery();
      display();
    }
    cVar8 = clock();
    dVar13 = (double)(((long)local_348 - (cVar6 + cVar7)) + cVar8) / 1000000.0;
    poVar9 = std::ostream::_M_insert<double>(dVar13);
    std::operator<<(poVar9," ");
    poVar9 = std::ostream::_M_insert<double>(dVar13 / 10000.0);
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::ostream::_M_insert<double>(dVar13);
    std::operator<<(poVar9," ");
    poVar9 = std::ostream::_M_insert<double>(dVar13 / 10000.0);
    std::endl<char,std::char_traits<char>>(poVar9);
    sch::CD_Scene::~CD_Scene(&testscene);
  }
  std::fstream::close();
  std::fstream::~fstream(&outfile);
  return;
}

Assistant:

void TestMaterial::GeneralTest()
{
  std::fstream outfile;
  outfile.open("/tmp/sch_generaltest_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);


  for (size_t k=0; k<stppObjects.size(); k++)
  {
    CD_Scene testscene;
    testscene.addObject(sObj[0]);

    sObj[0]->resetTransformation();

    testscene.addObject(&(stppObjects[k]));

    Vector3 position(
      (1.+7%5-3.),
      ((5%6-3)*(5.0/6)),
      ((5%7-3)*(5.0/7))
    );
    position *= DispersionScale;

    Vector3 axe(0, 0, 1);
    double angle(0);

    testscene[1]->setOrientation(angle,axe);
    testscene[1]->setPosition(position);

    testscene.sceneProximityQuery();

    display();

    clock_t begin, end;

    begin=clock();
    for (long j=0; j<RandomTestEnd; j++)
    {
      double a = (rand()/double(RAND_MAX)) ;
      double b = (rand()/double(RAND_MAX)) ;
      double c = (rand()/double(RAND_MAX)) ;
      double d = (rand()/double(RAND_MAX)) ;
      Vector3 v(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
    }
    end=clock();

    clock_t lostTime=end-begin;

    begin=clock();
    for (long j=0; j<RandomTestEnd; j++)
    {
      double a = (rand()/double(RAND_MAX)) ;
      double b = (rand()/double(RAND_MAX)) ;
      double c = (rand()/double(RAND_MAX)) ;
      double d = (rand()/double(RAND_MAX)) ;

      Vector3 v(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));

#ifdef DO_TEST
      Point3 p=testscene[1]->support(v);

# ifndef OUTPUT_FILE
      (void) p;
#else
      outfile<<p<<std::endl;
# endif // OUTPUT_FILE

#endif // DO_TEST
    }

#ifdef OUTPUT_FILE
    outfile.close();
#endif

    end=clock();


    begin=clock();

    for (long i=0; i<AnimationEnd; i++)
    {
      Scalar is= Scalar(i);
      axe[0] =  sin((42)*sin(0.2*AnimationSpeed*is));
      axe[1] =  sin((-43)*sin(0.2*AnimationSpeed*is));
      axe[2] =  cos((83)*sin(0.1*AnimationSpeed*is));

      angle=4*sin((97)*sin(0.2*sin(0.5*AnimationSpeed*is)));

      testscene[1]->setOrientation(angle,axe);

      testscene[1]->setPosition( position + Vector3(sin((20*(1))*sin(0.2*AnimationSpeed*is)),
                                 sin((71-140*(1))*sin(0.15*AnimationSpeed*is)),
                                 sin((20)*sin(0.2*AnimationSpeed*is)))*AnimationScale);
    }

    end=clock();

    lostTime=end-begin;

    begin=clock();

    for (long i=0; i<AnimationEnd; i++)
    {
      Scalar is = Scalar(i);
      axe[0] =  sin((42)*sin(0.2*AnimationSpeed*is));
      axe[1] =  sin((-43)*sin(0.2*AnimationSpeed*is));
      axe[2] =  cos((83)*sin(0.1*AnimationSpeed*is));

      angle=4*sin((97)*sin(0.2*sin(0.5*AnimationSpeed*is)));

      testscene[1]->setOrientation(angle,axe);

      testscene[1]->setPosition( position + Vector3(sin((20*(1))*sin(0.2*AnimationSpeed*is)),
                                 sin((71-140*(1))*sin(0.15*AnimationSpeed*is)),
                                 sin((20)*sin(0.2*AnimationSpeed*is)))*AnimationScale);

#ifdef DO_TEST
      testscene.sceneProximityQuery();
#endif

#ifdef TEST_HOLD
      std::cout<<i<<std::endl;
      system("pause");
#endif

      display();
    }
    end=clock();
    outfile   <<((double)(end- begin-lostTime) / CLOCKS_PER_SEC) << " " << ((double)(end - begin-lostTime) / CLOCKS_PER_SEC)/(AnimationEnd) <<  std::endl;
    std::cout <<((double)(end- begin-lostTime) / CLOCKS_PER_SEC) << " " << ((double)(end - begin-lostTime) / CLOCKS_PER_SEC)/(AnimationEnd) <<  std::endl;
  }
  outfile.close();
}